

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

int main(void)

{
  btree_kv_ops *pbVar1;
  btree_kv_ops **ops;
  int i;
  undefined4 in_stack_00000030;
  int in_stack_00000034;
  btree_kv_ops *in_stack_00000040;
  btree_kv_ops *in_stack_00000050;
  btree_kv_ops *in_stack_00000070;
  btree_kv_ops *in_stack_000000a0;
  undefined8 local_28 [3];
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_10 = local_28;
  local_4 = 0;
  pbVar1 = btree_kv_get_ku64_vu64();
  *local_10 = pbVar1;
  pbVar1 = btree_kv_get_ku32_vu64();
  local_10[1] = pbVar1;
  for (local_8 = 0; local_8 < 2; local_8 = local_8 + 1) {
    kv_init_ops_test(in_stack_00000034);
    kv_init_var_test((btree_kv_ops *)local_10[local_8]);
    kv_set_var_test(in_stack_00000040);
    kv_set_var_nentry_test((btree_kv_ops *)local_10[local_8]);
    kv_set_var_nentry_update_test((btree_kv_ops *)local_10[local_8]);
    kv_get_var_test((btree_kv_ops *)local_10[local_8]);
    kv_get_var_nentry_test((btree_kv_ops *)local_10[local_8]);
    kv_ins_var((btree_kv_ops *)local_10[local_8]);
    kv_ins_var_nentry_test((btree_kv_ops *)local_10[local_8]);
    kv_set_str_key_test((btree_kv_ops *)local_10[local_8]);
    kv_set_str_value_test(in_stack_00000070);
    kv_get_str_data_size_test((btree_kv_ops *)local_10[local_8]);
    kv_get_str_kv_size_test(in_stack_000000a0);
    kv_copy_var_test(in_stack_00000050);
    kv_copy_var_nentry_test((btree_kv_ops *)local_10[local_8]);
    kv_get_nth_idx_test((btree_kv_ops *)CONCAT44(in_stack_00000034,in_stack_00000030));
    kv_get_nth_splitter_test((btree_kv_ops *)local_10[local_8]);
    kv_cmp_key_str_test((btree_kv_ops *)local_10[local_8],local_8);
    kv_bid_to_value_to_bid_test(in_stack_00000040);
  }
  return 0;
}

Assistant:

int main()
{
    int i;

    #ifdef _MEMPOOL
        mempool_init();
    #endif

    btree_kv_ops ** ops = alca(btree_kv_ops*, 2);
    ops[0] = btree_kv_get_ku64_vu64();
    ops[1] = btree_kv_get_ku32_vu64();

    for (i=0; i<2; i++){

        kv_init_ops_test(i);
        kv_init_var_test(ops[i]);

        kv_set_var_test(ops[i]);
        kv_set_var_nentry_test(ops[i]);
        kv_set_var_nentry_update_test(ops[i]);

        kv_get_var_test(ops[i]);
        kv_get_var_nentry_test(ops[i]);

        kv_ins_var(ops[i]);
        kv_ins_var_nentry_test(ops[i]);

        kv_set_str_key_test(ops[i]);
        kv_set_str_value_test(ops[i]);

        kv_get_str_data_size_test(ops[i]);
        kv_get_str_kv_size_test(ops[i]);

        kv_copy_var_test(ops[i]);
        kv_copy_var_nentry_test(ops[i]);

        kv_get_nth_idx_test(ops[i]);
        kv_get_nth_splitter_test(ops[i]);

        kv_cmp_key_str_test(ops[i], i);
        kv_bid_to_value_to_bid_test(ops[i]);
    }

    return 0;
}